

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataReliablePdu.cpp
# Opt level: O0

void __thiscall DIS::DataReliablePdu::DataReliablePdu(DataReliablePdu *this)

{
  DataReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__DataReliablePdu_002719b0;
  this->_requestID = 0;
  this->_requiredReliabilityService = '\0';
  this->_pad1 = 0;
  this->_pad2 = '\0';
  this->_numberOfFixedDatumRecords = 0;
  this->_numberOfVariableDatumRecords = 0;
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::vector(&this->_fixedDatumRecords);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::vector
            (&this->_variableDatumRecords);
  Pdu::setPduType((Pdu *)this,'<');
  return;
}

Assistant:

DataReliablePdu::DataReliablePdu() : SimulationManagementWithReliabilityFamilyPdu(),
   _requestID(0), 
   _requiredReliabilityService(0), 
   _pad1(0), 
   _pad2(0), 
   _numberOfFixedDatumRecords(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 60 );
}